

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_mrope_cache_init
               (float theta_base_t,float theta_base_h,float theta_base_w,float theta_base_e,
               int *sections,bool indep_sects,float freq_scale,float *freq_factors,float *corr_dims,
               int64_t ne0,float ext_factor,float mscale,float *cache,float sin_sign,
               float theta_scale)

{
  int iVar1;
  float ext_factor_00;
  float mscale_00;
  float fVar2;
  long in_RDX;
  byte in_SIL;
  float *in_RDI;
  long in_R8;
  long in_R9;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM7_Da;
  float in_stack_00000008;
  float theta;
  int sector;
  float ff;
  int64_t i0;
  int sec_e;
  int sec_w;
  int sect_dims;
  float theta_e;
  float theta_w;
  float theta_h;
  float theta_t;
  undefined4 local_80;
  float *cos_theta;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float freq_scale_00;
  
  iVar1 = (int)*in_RDI + (int)in_RDI[1] + (int)in_RDI[2] + (int)in_RDI[3];
  ext_factor_00 = (float)((int)in_RDI[1] + (int)*in_RDI);
  mscale_00 = (float)((int)in_RDI[2] + (int)ext_factor_00);
  if (in_R8 < iVar1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x13b2,"GGML_ASSERT(%s) failed","sect_dims <= ne0");
  }
  fVar3 = in_XMM3_Da;
  fVar4 = in_XMM2_Da;
  fVar6 = in_XMM1_Da;
  fVar8 = in_XMM0_Da;
  for (cos_theta = (float *)0x0; (long)cos_theta < in_R8; cos_theta = (float *)((long)cos_theta + 2)
      ) {
    if (in_RDX == 0) {
      local_80 = 0x3f800000;
    }
    else {
      local_80 = *(undefined4 *)(in_RDX + ((long)cos_theta / 2) * 4);
    }
    fVar2 = (float)(((long)cos_theta / 2) % (long)iVar1);
    fVar5 = fVar4;
    fVar7 = fVar6;
    freq_scale_00 = fVar8;
    if (((((in_SIL & 1) != 0) && (freq_scale_00 = in_XMM0_Da, fVar2 != 0.0)) &&
        (fVar7 = in_XMM1_Da, freq_scale_00 = fVar8, fVar2 != *in_RDI)) &&
       ((fVar5 = in_XMM2_Da, fVar7 = fVar6, fVar2 != ext_factor_00 &&
        (fVar5 = fVar4, fVar2 == mscale_00)))) {
      fVar3 = in_XMM3_Da;
    }
    rope_yarn(in_XMM7_Da,freq_scale_00,(float *)CONCAT44(fVar7,fVar5),CONCAT44(fVar3,iVar1),
              ext_factor_00,mscale_00,cos_theta,(float *)CONCAT44(local_80,fVar2));
    *(float *)(in_R9 + 4 + (long)cos_theta * 4) =
         in_XMM7_Da * *(float *)(in_R9 + 4 + (long)cos_theta * 4);
    fVar8 = in_stack_00000008 * freq_scale_00;
    fVar4 = in_stack_00000008 * fVar5;
    fVar6 = in_stack_00000008 * fVar7;
    fVar3 = in_stack_00000008 * fVar3;
  }
  return;
}

Assistant:

static void ggml_mrope_cache_init(
     float theta_base_t, float theta_base_h, float theta_base_w, float theta_base_e, int sections[4], bool indep_sects,
     float freq_scale, const float * freq_factors, float corr_dims[2], int64_t ne0, float ext_factor, float mscale,
     float * cache, float sin_sign, float theta_scale) {
    // ref: https://github.com/jquesnelle/yarn/blob/master/scaled_rope/LlamaYaRNScaledRotaryEmbedding.py
    float theta_t = theta_base_t;
    float theta_h = theta_base_h;
    float theta_w = theta_base_w;
    float theta_e = theta_base_e;  // extra position id for vision encoder
    int sect_dims = sections[0] + sections[1] + sections[2] + sections[3];
    int sec_w = sections[1] + sections[0];
    int sec_e = sections[2] + sec_w;
    GGML_ASSERT(sect_dims <= ne0);

    for (int64_t i0 = 0; i0 < ne0; i0 += 2) {
        const float ff = freq_factors ? freq_factors[i0/2] : 1.0f;

        int sector = (i0 / 2) % sect_dims;
        if (indep_sects) {
            // compute theta independently for each dim sections
            // (i.e. reset corresponding theta when `i0` go from one section to another)
            if (sector == 0) {
                theta_t = theta_base_t;
            }
            else if (sector == sections[0]) {
                theta_h = theta_base_h;;
            }
            else if (sector == sec_w) {
                theta_w = theta_base_w;
            }
            else if (sector == sec_e) {
                theta_e = theta_base_e;
            }
        }

        float theta = theta_t;
        if (sector >= sections[0] && sector < sec_w) {
            theta = theta_h;
        }
        else if (sector >= sec_w && sector < sec_w + sections[2]) {
            theta = theta_w;
        }
        else if (sector >= sec_w + sections[2]) {
            theta = theta_e;
        }

        rope_yarn(
            theta/ff, freq_scale, corr_dims, i0, ext_factor, mscale, &cache[i0 + 0], &cache[i0 + 1]
        );
        cache[i0 + 1] *= sin_sign;

        theta_t *= theta_scale;
        theta_w *= theta_scale;
        theta_h *= theta_scale;
        theta_e *= theta_scale;
    }
}